

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_report_handler.cpp
# Opt level: O1

sc_actions sc_core::sc_report_handler::execute(sc_msg_def *md,sc_severity severity_)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  uint *puVar6;
  uint *puVar7;
  long lVar8;
  uint uVar9;
  
  uVar2 = (ulong)severity_;
  uVar3 = md->sev_actions[uVar2];
  if (uVar3 == 0) {
    uVar3 = md->actions;
  }
  if (uVar3 == 0) {
    uVar3 = (&sev_actions)[uVar2];
  }
  uVar3 = ~suppress_mask & uVar3 | force_mask;
  if (md->sev_call_count[uVar2] != 0xffffffff) {
    md->sev_call_count[uVar2] = md->sev_call_count[uVar2] + 1;
  }
  if (md->call_count != 0xffffffff) {
    md->call_count = md->call_count + 1;
  }
  if (*(int *)(sev_call_count + uVar2 * 4) != -1) {
    *(int *)(sev_call_count + uVar2 * 4) = *(int *)(sev_call_count + uVar2 * 4) + 1;
  }
  uVar4 = severity_ + SC_WARNING;
  uVar9 = 1 << ((byte)uVar4 & 0x1f);
  uVar1 = md->limit_mask;
  lVar8 = (long)(int)severity_;
  puVar7 = (uint *)0x0;
  if ((uVar1 & 1) != 0) {
    puVar7 = &md->limit;
  }
  puVar5 = md->sev_limit + lVar8;
  if ((uVar1 >> (uVar4 & 0x1f) & 1) == 0) {
    puVar5 = puVar7;
  }
  uVar4 = 1 << (uVar4 & 0x1f) | 1;
  puVar7 = (uint *)(sev_limit + lVar8 * 4);
  if ((uVar1 & uVar4) != 0) {
    puVar7 = puVar5;
  }
  if (1 < *puVar7 + 1) {
    puVar5 = (uint *)0x0;
    if ((uVar1 & uVar9) != 0) {
      puVar5 = md->sev_call_count + lVar8;
    }
    puVar6 = &md->call_count;
    if ((uVar1 & 1) == 0) {
      puVar6 = puVar5;
    }
    if ((uVar1 & uVar9) != 0) {
      puVar6 = md->sev_call_count + lVar8;
    }
    puVar5 = (uint *)(sev_call_count + lVar8 * 4);
    if ((uVar1 & uVar4) != 0) {
      puVar5 = puVar6;
    }
    if (*puVar7 <= *puVar5) {
      uVar3 = uVar3 | 0x40;
    }
  }
  return uVar3;
}

Assistant:

sc_actions sc_report_handler::execute(sc_msg_def* md, sc_severity severity_)
{
    sc_actions actions = md->sev_actions[severity_]; // high prio

    if ( SC_UNSPECIFIED == actions ) // middle prio
	actions = md->actions;

    if ( SC_UNSPECIFIED == actions ) // the lowest prio
	actions = sev_actions[severity_];

    actions &= ~suppress_mask; // higher than the high prio
    actions |= force_mask; // higher than above, and the limit is the highest

    unsigned * limit = 0;
    unsigned * call_count = 0;

    // just increment counters and check for overflow
    if ( md->sev_call_count[severity_] < UINT_MAX )
	md->sev_call_count[severity_]++;
    if ( md->call_count < UINT_MAX )
	md->call_count++;
    if ( sev_call_count[severity_] < UINT_MAX )
	sev_call_count[severity_]++;

    if ( md->limit_mask & (1 << (severity_ + 1)) )
    {
	limit = md->sev_limit + severity_;
	call_count = md->sev_call_count + severity_;
    }
    if ( !limit && (md->limit_mask & 1) )
    {
	limit = &md->limit;
	call_count = &md->call_count;
    }
    if ( !limit )
    {
	limit = sev_limit + severity_;
	call_count = sev_call_count + severity_;
    }
    if ( *limit == 0 )
    {
	// stop limit disabled
    }
    else if ( *limit != UINT_MAX )
    {
	if ( *call_count >= *limit )
	    actions |= SC_STOP; // force sc_stop()
    }
    return actions;
}